

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96KeypairGen(octet *privkey,octet *pubkey,bign_params *params,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  gen_i rng_state_00;
  gen_i dest;
  gen_i count;
  void *in_RCX;
  bign96_deep_i in_RDX;
  void *in_RSI;
  word *in_RDI;
  bign_params *in_R8;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffff98;
  gen_i rng_00;
  size_t n_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar2;
  
  bVar1 = memIsValid(in_RDX,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else if (*(long *)in_RDX == 0x60) {
    if (in_RCX == (void *)0x0) {
      eVar2 = 0x130;
    }
    else {
      bign96Start_keep(in_RDX);
      rng_state_00 = (gen_i)blobCreate(in_stack_ffffffffffffff98);
      if (rng_state_00 == (gen_i)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bign96Start(in_RCX,in_R8);
        if (eVar2 == 0) {
          n_00 = *(size_t *)(*(long *)(rng_state_00 + 0x18) + 0x30);
          rng_00 = rng_state_00;
          bVar1 = memIsValid(in_RDI,0x18);
          if ((bVar1 != 0) && (bVar1 = memIsValid(in_RSI,0x30), bVar1 != 0)) {
            dest = rng_state_00 + n_00 * 8 + *(long *)rng_state_00;
            count = dest + n_00 * 0x10;
            bVar1 = zzRandNZMod(&in_R8->l,(word *)CONCAT44(eVar2,in_stack_ffffffffffffffc8),n_00,
                                rng_00,rng_state_00);
            if (bVar1 == 0) {
              blobClose((blob_t)0x15438a);
              return 0x130;
            }
            bVar1 = ecMulA(Q,(word *)stack,
                           (ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,(size_t)in_RSI,in_RDX);
            if (bVar1 == 0) {
              eVar2 = 0x1f6;
            }
            else {
              u64To(dest,(size_t)count,(u64 *)0x1543d6);
              (**(code **)(*(long *)(rng_state_00 + 0x18) + 0x48))
                        (in_RSI,dest,*(long *)(rng_state_00 + 0x18),count);
              (**(code **)(*(long *)(rng_state_00 + 0x18) + 0x48))
                        ((long)in_RSI + 0x18,dest + n_00 * 8,*(long *)(rng_state_00 + 0x18),count);
            }
            blobClose((blob_t)0x154446);
            return eVar2;
          }
          blobClose((blob_t)0x154308);
          eVar2 = 0x6d;
        }
        else {
          blobClose((blob_t)0x1542ad);
        }
      }
    }
  }
  else {
    eVar2 = 0x1f6;
  }
  return eVar2;
}

Assistant:

err_t bign96KeypairGen(octet privkey[24], octet pubkey[48],
	const bign_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96KeypairGen_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <-R {1,2,..., q - 1}
	if (!zzRandNZMod(d, ec->f->mod, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить ключи
		wwTo(privkey, 24, d);
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + 24, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}